

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

void SSL_get0_ech_retry_configs(SSL *ssl,uint8_t **out_retry_configs,size_t *out_retry_configs_len)

{
  SSL_HANDSHAKE *pSVar1;
  
  pSVar1 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
  if ((pSVar1 != (SSL_HANDSHAKE *)0x0) && ((pSVar1->field_0x6c8 & 2) != 0)) {
    *out_retry_configs = (pSVar1->ech_retry_configs).data_;
    *out_retry_configs_len = (pSVar1->ech_retry_configs).size_;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,0x3bf,"void SSL_get0_ech_retry_configs(const SSL *, const uint8_t **, size_t *)");
}

Assistant:

void SSL_get0_ech_retry_configs(const SSL *ssl,
                                const uint8_t **out_retry_configs,
                                size_t *out_retry_configs_len) {
  const SSL_HANDSHAKE *hs = ssl->s3->hs.get();
  if (!hs || !hs->ech_authenticated_reject) {
    // It is an error to call this function except in response to
    // |SSL_R_ECH_REJECTED|. Returning an empty string risks the caller
    // mistakenly believing the server has disabled ECH. Instead, return a
    // non-empty ECHConfigList with a syntax error, so the subsequent
    // |SSL_set1_ech_config_list| call will fail.
    assert(0);
    static const uint8_t kPlaceholder[] = {
        kECHConfigVersion >> 8, kECHConfigVersion & 0xff, 0xff, 0xff, 0xff};
    *out_retry_configs = kPlaceholder;
    *out_retry_configs_len = sizeof(kPlaceholder);
    return;
  }

  *out_retry_configs = hs->ech_retry_configs.data();
  *out_retry_configs_len = hs->ech_retry_configs.size();
}